

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O0

bool __thiscall QGraphicsSceneBspTreeIndex::event(QGraphicsSceneBspTreeIndex *this,QEvent *event)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  TimerId TVar4;
  TimerId TVar5;
  QGraphicsSceneBspTreeIndexPrivate *pQVar6;
  QEvent *in_RSI;
  QEvent *in_RDI;
  QGraphicsSceneBspTreeIndexPrivate *d;
  QGraphicsSceneBspTreeIndexPrivate *in_stack_00000040;
  
  pQVar6 = d_func((QGraphicsSceneBspTreeIndex *)0xa1fd71);
  TVar3 = QEvent::type(in_RSI);
  if ((TVar3 == Timer) && (bVar1 = QBasicTimer::isActive(&pQVar6->indexTimer), bVar1)) {
    TVar4 = QTimerEvent::id((QTimerEvent *)in_RSI);
    TVar5 = QBasicTimer::id(&pQVar6->indexTimer);
    if (TVar4 == TVar5) {
      if ((pQVar6->restartIndexTimer & 1U) == 0) {
        QGraphicsSceneBspTreeIndexPrivate::_q_updateIndex(in_stack_00000040);
      }
      else {
        pQVar6->restartIndexTimer = false;
      }
    }
  }
  bVar2 = QObject::event(in_RDI);
  return (bool)(bVar2 & 1);
}

Assistant:

bool QGraphicsSceneBspTreeIndex::event(QEvent *event)
{
    Q_D(QGraphicsSceneBspTreeIndex);
    if (event->type() == QEvent::Timer) {
            if (d->indexTimer.isActive() && static_cast<QTimerEvent *>(event)->id() == d->indexTimer.id()) {
                if (d->restartIndexTimer) {
                    d->restartIndexTimer = false;
                } else {
                    // this call will kill the timer
                    d->_q_updateIndex();
                }
            }
    }
    return QObject::event(event);
}